

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iopause.c
# Opt level: O1

void iopause(iopause_fd *x,uint len,taia *deadline,taia *stamp)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  fd_set wfds;
  fd_set rfds;
  timeval tv;
  taia t;
  fd_set local_158;
  fd_set local_d8;
  timeval local_58;
  taia local_48;
  
  uVar3 = (ulong)len;
  iVar4 = taia_less(deadline,stamp);
  iVar7 = 0;
  if (iVar4 == 0) {
    local_48.atto = stamp->atto;
    local_48.sec.x = (stamp->sec).x;
    local_48.nano = stamp->nano;
    taia_sub(&local_48,deadline,&local_48);
    dVar9 = taia_approx(&local_48);
    dVar10 = 1000.0;
    if (dVar9 <= 1000.0) {
      dVar10 = dVar9;
    }
    iVar7 = (int)(dVar10 * 1000.0 + 20.0);
  }
  if (len != 0) {
    uVar5 = 0;
    do {
      x[uVar5].revents = 0;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  local_d8.fds_bits[0] = 0;
  local_d8.fds_bits[1] = 0;
  local_d8.fds_bits[2] = 0;
  local_d8.fds_bits[3] = 0;
  local_d8.fds_bits[4] = 0;
  local_d8.fds_bits[5] = 0;
  local_d8.fds_bits[6] = 0;
  local_d8.fds_bits[7] = 0;
  local_d8.fds_bits[8] = 0;
  local_d8.fds_bits[9] = 0;
  local_d8.fds_bits[10] = 0;
  local_d8.fds_bits[0xb] = 0;
  local_d8.fds_bits[0xc] = 0;
  local_d8.fds_bits[0xd] = 0;
  local_d8.fds_bits[0xe] = 0;
  local_d8.fds_bits[0xf] = 0;
  local_158.fds_bits[0] = 0;
  local_158.fds_bits[1] = 0;
  local_158.fds_bits[2] = 0;
  local_158.fds_bits[3] = 0;
  local_158.fds_bits[4] = 0;
  local_158.fds_bits[5] = 0;
  local_158.fds_bits[6] = 0;
  local_158.fds_bits[7] = 0;
  local_158.fds_bits[8] = 0;
  local_158.fds_bits[9] = 0;
  local_158.fds_bits[10] = 0;
  local_158.fds_bits[0xb] = 0;
  local_158.fds_bits[0xc] = 0;
  local_158.fds_bits[0xd] = 0;
  local_158.fds_bits[0xe] = 0;
  local_158.fds_bits[0xf] = 0;
  if (len == 0) {
    iVar4 = 1;
  }
  else {
    iVar4 = 1;
    uVar5 = 0;
    do {
      uVar2 = x[uVar5].fd;
      if (uVar2 < 0x400) {
        iVar8 = uVar2 + 1;
        if ((int)uVar2 < iVar4) {
          iVar8 = iVar4;
        }
        uVar1 = x[uVar5].events;
        if ((uVar1 & 1) != 0) {
          local_d8.fds_bits[uVar2 >> 6] = local_d8.fds_bits[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f)
          ;
        }
        iVar4 = iVar8;
        if ((uVar1 & 4) != 0) {
          local_158.fds_bits[uVar2 >> 6] =
               local_158.fds_bits[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f);
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  local_58.tv_sec = (__time_t)(iVar7 / 1000);
  local_58.tv_usec = (__suseconds_t)((iVar7 % 1000) * 1000);
  iVar4 = select(iVar4,&local_d8,&local_158,(fd_set *)0x0,&local_58);
  if (len != 0 && 0 < iVar4) {
    uVar5 = 0;
    do {
      uVar2 = x[uVar5].fd;
      uVar6 = (ulong)uVar2;
      if (uVar6 < 0x400) {
        if (((x[uVar5].events & 1U) != 0) &&
           (((ulong)local_d8.fds_bits[uVar2 >> 6] >> (uVar6 & 0x3f) & 1) != 0)) {
          *(byte *)&x[uVar5].revents = (byte)x[uVar5].revents | 1;
        }
        if (((x[uVar5].events & 4U) != 0) &&
           (((ulong)local_158.fds_bits[uVar2 >> 6] >> (uVar6 & 0x3f) & 1) != 0)) {
          *(byte *)&x[uVar5].revents = (byte)x[uVar5].revents | 4;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  return;
}

Assistant:

void iopause(iopause_fd *x,unsigned int len,struct taia *deadline,struct taia *stamp)
{
  struct taia t;
  int millisecs;
  double d;
  int i;

  if (taia_less(deadline,stamp))
    millisecs = 0;
  else {
    t = *stamp;
    taia_sub(&t,deadline,&t);
    d = taia_approx(&t);
    if (d > 1000.0) d = 1000.0;
    millisecs = d * 1000.0 + 20.0;
  }

  for (i = 0;i < len;++i)
    x[i].revents = 0;

#ifdef IOPAUSE_POLL

  poll(x,len,millisecs);
  /* XXX: some kernels apparently need x[0] even if len is 0 */
  /* XXX: how to handle EAGAIN? are kernels really this dumb? */
  /* XXX: how to handle EINVAL? when exactly can this happen? */

#else
{

  struct timeval tv;
  fd_set rfds;
  fd_set wfds;
  int nfds;
  int fd;

  FD_ZERO(&rfds);
  FD_ZERO(&wfds);

  nfds = 1;
  for (i = 0;i < len;++i) {
    fd = x[i].fd;
    if (fd < 0) continue;
    if (fd >= 8 * sizeof(fd_set)) continue; /*XXX*/

    if (fd >= nfds) nfds = fd + 1;
    if (x[i].events & IOPAUSE_READ) FD_SET(fd,&rfds);
    if (x[i].events & IOPAUSE_WRITE) FD_SET(fd,&wfds);
  }

  tv.tv_sec = millisecs / 1000;
  tv.tv_usec = 1000 * (millisecs % 1000);

  if (select(nfds,&rfds,&wfds,(fd_set *) 0,&tv) <= 0)
    return;
    /* XXX: for EBADF, could seek out and destroy the bad descriptor */

  for (i = 0;i < len;++i) {
    fd = x[i].fd;
    if (fd < 0) continue;
    if (fd >= 8 * sizeof(fd_set)) continue; /*XXX*/

    if (x[i].events & IOPAUSE_READ)
      if (FD_ISSET(fd,&rfds)) x[i].revents |= IOPAUSE_READ;
    if (x[i].events & IOPAUSE_WRITE)
      if (FD_ISSET(fd,&wfds)) x[i].revents |= IOPAUSE_WRITE;
  }

}
#endif

}